

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::EmitFunctionBody(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  OpCode OVar1;
  ushort uVar2;
  ParseNode *pPVar3;
  ParseableFunctionInfo *pPVar4;
  Symbol *sym;
  code *pcVar5;
  SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  bool bVar7;
  uint sourceContextId;
  ParseNode *pPVar8;
  ParseNodeBin *pPVar9;
  CapturedSymMap *this_00;
  Type *ppSVar10;
  undefined4 *puVar11;
  ParseNodePtr this_01;
  ParseNodePtr local_58;
  ParseNode *stmt;
  undefined1 local_48 [8];
  Iterator __iter;
  
  this_01 = funcInfo->root->pnodeBody;
  __iter.current = (NodeBase *)this;
  if (this_01->nop == knopList) {
    pPVar8 = (ParseNode *)__tls_get_addr(&PTR_0155fe48);
    stmt = pPVar8;
    do {
      pPVar9 = ParseNode::AsParseNodeBin(this_01);
      local_58 = pPVar9->pnode1;
      pSVar6 = __iter.list;
      if ((local_58->grfpn & 0x4000) != 0) {
        this_00 = FuncInfo::EnsureCapturedSymMap(funcInfo);
        local_48 = (undefined1  [8])
                   JsUtil::
                   BaseDictionary<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::Item(this_00,&local_58);
        __iter.list = (SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
        while( true ) {
          if (__iter.list == (SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pPVar8->nop = knopName;
            pPVar8->field_0x1 = 0;
            pPVar8->grfpn = 0;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) goto LAB_008122cc;
            pPVar8->nop = knopNone;
            pPVar8->field_0x1 = 0;
            pPVar8->grfpn = 0;
          }
          __iter.list = (SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)
                        ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          pSVar6 = (SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if ((undefined1  [8])__iter.list == local_48) break;
          ppSVar10 = SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)local_48);
          bVar7 = Symbol::GetIsCommittedToSlot(*ppSVar10);
          if (!bVar7) {
            if ((*ppSVar10)->location == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pPVar8->nop = knopName;
              pPVar8->field_0x1 = 0;
              pPVar8->grfpn = 0;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x9e9,"(sym->GetLocation() != Js::Constants::NoProperty)",
                                 "sym->GetLocation() != Js::Constants::NoProperty");
              if (!bVar7) goto LAB_008122cc;
              pPVar8->nop = knopNone;
              pPVar8->field_0x1 = 0;
              pPVar8->grfpn = 0;
            }
            *(ushort *)&(*ppSVar10)->field_0x42 = *(ushort *)&(*ppSVar10)->field_0x42 | 0x400;
            pPVar3 = (*ppSVar10)->decl;
            if (pPVar3 == (ParseNode *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pPVar8->nop = knopName;
              pPVar8->field_0x1 = 0;
              pPVar8->grfpn = 0;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x9ec,"(decl)","decl");
              if (!bVar7) goto LAB_008122cc;
              pPVar8->nop = knopNone;
              pPVar8->field_0x1 = 0;
              pPVar8->grfpn = 0;
            }
            sourceContextId =
                 Js::FunctionProxy::GetSourceContextId
                           (&funcInfo->byteCodeFunction->super_FunctionProxy);
            pPVar4 = funcInfo->byteCodeFunction;
            if ((pPVar4->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pPVar8 = stmt;
              pPVar8->nop = knopName;
              pPVar8->field_0x1 = 0;
              pPVar8->grfpn = 0;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar7) goto LAB_008122cc;
              pPVar8->nop = knopNone;
              pPVar8->field_0x1 = 0;
              pPVar8->grfpn = 0;
            }
            bVar7 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015cd718,DelayCapturePhase,sourceContextId,
                               ((pPVar4->super_FunctionProxy).functionInfo.ptr)->functionId);
            if (bVar7) {
              Output::Print(L"--- DelayCapture: Committed symbol \'%s\' to slot.\n",
                            ((*ppSVar10)->name).string.ptr);
              Output::Flush();
            }
            uVar2 = *(ushort *)&(*ppSVar10)->field_0x42;
            *(ushort *)&(*ppSVar10)->field_0x42 = uVar2 & 0xfffe;
            sym = *ppSVar10;
            OVar1 = pPVar3->nop;
            EmitPropStore((ByteCodeGenerator *)__iter.current,sym->location,sym,sym->pid,funcInfo,
                          OVar1 == knopLetDecl,OVar1 == knopConstDecl,false,false);
            *(ushort *)&(*ppSVar10)->field_0x42 =
                 *(ushort *)&(*ppSVar10)->field_0x42 & 0xfffe | uVar2 & 1;
            pPVar8 = stmt;
          }
        }
      }
      __iter.list = pSVar6;
      EmitTopLevelStatement((ByteCodeGenerator *)__iter.current,local_58,funcInfo,0);
      pPVar9 = ParseNode::AsParseNodeBin(this_01);
      this_01 = pPVar9->pnode2;
    } while (this_01->nop == knopList);
  }
  if ((this_01->grfpn & 0x4000) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xa00,"(!pnode->CapturesSyms())","!pnode->CapturesSyms()");
    if (!bVar7) {
LAB_008122cc:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar11 = 0;
  }
  EmitTopLevelStatement((ByteCodeGenerator *)__iter.current,this_01,funcInfo,0);
  return;
}

Assistant:

void ByteCodeGenerator::EmitFunctionBody(FuncInfo *funcInfo)
{
    // Emit a function body. Only explicit returns and the implicit "undef" at the bottom
    // get copied to the return register.
    ParseNode *pnodeBody = funcInfo->root->pnodeBody;
    ParseNode *pnode = pnodeBody;
    while (pnode->nop == knopList)
    {
        ParseNode *stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt->CapturesSyms())
        {
            CapturedSymMap *map = funcInfo->EnsureCapturedSymMap();
            SList<Symbol*> *list = map->Item(stmt);
            FOREACH_SLIST_ENTRY(Symbol*, sym, list)
            {
                if (!sym->GetIsCommittedToSlot())
                {
                    Assert(sym->GetLocation() != Js::Constants::NoProperty);
                    sym->SetIsCommittedToSlot();
                    ParseNode *decl = sym->GetDecl();
                    Assert(decl);
                    if (PHASE_TRACE(Js::DelayCapturePhase, funcInfo->byteCodeFunction))
                    {
                        Output::Print(_u("--- DelayCapture: Committed symbol '%s' to slot.\n"),
                            sym->GetName().GetBuffer());
                        Output::Flush();
                    }
                    // REVIEW[ianhall]: HACK to work around this causing an error due to sym not yet being initialized
                    // what is this doing? Why are we assigning sym to itself?
                    bool old = sym->GetNeedDeclaration();
                    sym->SetNeedDeclaration(false);
                    this->EmitPropStore(sym->GetLocation(), sym, sym->GetPid(), funcInfo, decl->nop == knopLetDecl, decl->nop == knopConstDecl);
                    sym->SetNeedDeclaration(old);
                }
            }
            NEXT_SLIST_ENTRY;
        }
        EmitTopLevelStatement(stmt, funcInfo, false);
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    Assert(!pnode->CapturesSyms());
    EmitTopLevelStatement(pnode, funcInfo, false);
}